

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_track.cpp
# Opt level: O2

void __thiscall cp::CoMTrack::calcRefZMP(CoMTrack *this,Vector2 *end_cp)

{
  double b;
  double local_f0;
  double local_e8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_e0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_b8;
  Vector2 *local_58 [3];
  double local_40;
  RhsNested local_38;
  
  *(double *)(this + 0x30) = *(double *)(this + 0x18);
  *(undefined8 *)(this + 0x38) = *(undefined8 *)this;
  *(double *)(this + 0x40) = *(double *)(this + 0x28);
  local_e8 = exp(*(double *)(this + 0x18) * *(double *)(this + 0x28));
  calcCPTrack((CoMTrack *)&local_b8,*(double *)(this + 0x30));
  *(undefined8 *)(this + 0x60) = local_b8._0_8_;
  *(LhsNested *)(this + 0x68) = local_b8.m_lhs.m_lhs;
  Eigen::operator*(&local_e0,&local_e8,(StorageBaseType *)(this + 0x60));
  local_40 = local_e0.m_lhs.m_functor.m_other;
  local_38 = local_e0.m_rhs;
  local_f0 = 1.0 - local_e8;
  local_58[0] = end_cp;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
  ::operator/(&local_b8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
               *)local_58,&local_f0);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,2,1,0,2,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x70),&local_b8);
  return;
}

Assistant:

void CoMTrack::calcRefZMP(const Vector2& end_cp) {
  setStepVariable();
  double b = exp(w * st_s);
  now_cp = calcCPTrack(st_s);
  ref_zmp = (end_cp - b * now_cp) / (1 - b);
}